

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

void mpz_gcdext(__mpz_struct *g,__mpz_struct *s,__mpz_struct *t,__mpz_struct *u,__mpz_struct *v)

{
  int iVar1;
  mp_limb_t *pmVar2;
  undefined8 uVar3;
  ulong *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  mp_bitcnt_t mVar8;
  mp_bitcnt_t mVar9;
  mp_bitcnt_t bits;
  mp_bitcnt_t bit_index;
  __mpz_struct *b;
  long lVar10;
  mp_bitcnt_t bits_00;
  bool bVar11;
  __mpz_struct local_c8;
  __mpz_struct local_b8;
  __mpz_struct local_a8;
  __mpz_struct local_98;
  mpz_t tu;
  mpz_t t1;
  __mpz_struct *local_60;
  __mpz_struct *local_58;
  __mpz_struct *local_50;
  __mpz_struct *local_48;
  
  iVar7 = u->_mp_size;
  iVar1 = v->_mp_size;
  if (iVar7 == 0) {
    mpz_abs(g,v);
    if (s != (__mpz_struct *)0x0) {
      s->_mp_size = 0;
    }
    if (t != (__mpz_struct *)0x0) {
      mpz_set_si(t,(long)(int)((uint)(iVar1 != 0) | iVar1 >> 0x1f));
      return;
    }
  }
  else if (iVar1 == 0) {
    mpz_abs(g,u);
    if (s != (__mpz_struct *)0x0) {
      mpz_set_si(s,(long)(int)(iVar7 >> 0x1f | 1));
    }
    if (t != (__mpz_struct *)0x0) {
      t->_mp_size = 0;
    }
  }
  else {
    tu[0]._mp_alloc = 0;
    tu[0]._mp_size = 0;
    tu[0]._mp_d = &mpz_init::dummy_limb;
    local_a8._mp_alloc = 0;
    local_a8._mp_size = 0;
    local_a8._mp_d = &mpz_init::dummy_limb;
    local_c8._mp_alloc = 0;
    local_c8._mp_size = 0;
    local_c8._mp_d = &mpz_init::dummy_limb;
    local_98._mp_alloc = 0;
    local_98._mp_size = 0;
    local_98._mp_d = &mpz_init::dummy_limb;
    local_b8._mp_alloc = 0;
    local_b8._mp_size = 0;
    local_b8._mp_d = &mpz_init::dummy_limb;
    t1[0]._mp_alloc = 0;
    t1[0]._mp_size = 0;
    t1[0]._mp_d = &mpz_init::dummy_limb;
    mpz_abs(tu,u);
    mVar8 = mpz_make_odd(tu);
    mpz_abs(&local_a8,v);
    mVar9 = mpz_make_odd(&local_a8);
    pmVar2 = tu[0]._mp_d;
    iVar7 = tu[0]._mp_size;
    bits = mVar9;
    if (mVar8 < mVar9) {
      bits = mVar8;
    }
    mVar8 = mVar8 - bits;
    mVar9 = mVar9 - bits;
    bit_index = mVar9;
    bits_00 = mVar8;
    local_60 = v;
    local_58 = u;
    local_50 = s;
    local_48 = t;
    if (tu[0]._mp_size < local_a8._mp_size) {
      iVar1 = local_a8._mp_alloc;
      tu[0]._mp_d = local_a8._mp_d;
      local_a8._mp_d = pmVar2;
      tu[0]._mp_size = local_a8._mp_size;
      local_a8._mp_size = iVar7;
      local_a8._mp_alloc = tu[0]._mp_alloc;
      bit_index = mVar8;
      bits_00 = mVar9;
      local_60 = u;
      local_58 = v;
      local_50 = t;
      local_48 = s;
      tu[0]._mp_alloc = iVar1;
    }
    mpz_tdiv_qr(t1,tu,tu,&local_a8);
    mpz_mul_2exp(t1,t1,bits_00);
    mpz_setbit(&local_98,bit_index);
    lVar10 = mVar9 + mVar8;
    if (tu[0]._mp_size < 1) {
      mpz_setbit(&local_b8,bits_00);
    }
    else {
      mVar8 = mpz_make_odd(tu);
      mpz_setbit(&local_b8,bits_00 + mVar8);
      lVar10 = lVar10 + mVar8;
      while( true ) {
        iVar7 = mpz_cmp(tu,&local_a8);
        if (iVar7 == 0) break;
        if (iVar7 < 0) {
          mpz_sub(&local_a8,&local_a8,tu);
          mpz_add(&local_b8,&local_b8,t1);
          b = &local_98;
          mpz_add(&local_c8,&local_c8,b);
          mVar8 = mpz_make_odd(&local_a8);
          mpz_mul_2exp(t1,t1,mVar8);
        }
        else {
          mpz_sub(tu,tu,&local_a8);
          mpz_add(t1,&local_b8,t1);
          mpz_add(&local_98,&local_c8,&local_98);
          mVar8 = mpz_make_odd(tu);
          mpz_mul_2exp(&local_b8,&local_b8,mVar8);
          b = &local_c8;
        }
        mpz_mul_2exp(b,b,mVar8);
        lVar10 = lVar10 + mVar8;
      }
    }
    mpz_mul_2exp(&local_a8,&local_a8,bits);
    mpz_neg(&local_c8,&local_c8);
    mpz_divexact(&local_98,local_60,&local_a8);
    mpz_abs(&local_98,&local_98);
    mpz_divexact(t1,local_58,&local_a8);
    mpz_abs(t1,t1);
    while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
      if (((local_c8._mp_size != 0) && ((*local_c8._mp_d & 1) != 0)) ||
         ((local_b8._mp_size != 0 && ((*local_b8._mp_d & 1) != 0)))) {
        mpz_sub(&local_c8,&local_c8,&local_98);
        mpz_add(&local_b8,&local_b8,t1);
      }
      mpz_tdiv_q_2exp(&local_c8,&local_c8,1);
      mpz_tdiv_q_2exp(&local_b8,&local_b8,1);
    }
    mpz_add(&local_98,&local_c8,&local_98);
    iVar7 = mpz_cmpabs(&local_c8,&local_98);
    pmVar2 = local_c8._mp_d;
    uVar3 = local_c8._0_8_;
    if (0 < iVar7) {
      local_c8._mp_alloc = local_98._mp_alloc;
      local_c8._mp_size = local_98._mp_size;
      uVar5 = local_c8._0_8_;
      local_c8._mp_d = local_98._mp_d;
      local_c8._mp_alloc = (int)uVar3;
      local_c8._mp_size = SUB84(uVar3,4);
      local_98._mp_alloc = local_c8._mp_alloc;
      local_98._mp_size = local_c8._mp_size;
      local_98._mp_d = pmVar2;
      local_c8._0_8_ = uVar5;
      mpz_sub(&local_b8,&local_b8,t1);
    }
    if (local_58->_mp_size < 0) {
      mpz_neg(&local_c8,&local_c8);
    }
    if (local_60->_mp_size < 0) {
      mpz_neg(&local_b8,&local_b8);
    }
    pmVar2 = g->_mp_d;
    g->_mp_d = local_a8._mp_d;
    uVar3._0_4_ = g->_mp_alloc;
    uVar3._4_4_ = g->_mp_size;
    g->_mp_alloc = local_a8._mp_alloc;
    g->_mp_size = local_a8._mp_size;
    if (local_50 != (__mpz_struct *)0x0) {
      puVar4 = local_50->_mp_d;
      local_50->_mp_d = local_c8._mp_d;
      uVar5._0_4_ = local_50->_mp_alloc;
      uVar5._4_4_ = local_50->_mp_size;
      local_50->_mp_alloc = local_c8._mp_alloc;
      local_50->_mp_size = local_c8._mp_size;
      local_c8._0_8_ = uVar5;
      local_c8._mp_d = puVar4;
    }
    if (local_48 != (__mpz_struct *)0x0) {
      puVar4 = local_48->_mp_d;
      local_48->_mp_d = local_b8._mp_d;
      uVar6._0_4_ = local_48->_mp_alloc;
      uVar6._4_4_ = local_48->_mp_size;
      local_48->_mp_alloc = local_b8._mp_alloc;
      local_48->_mp_size = local_b8._mp_size;
      local_b8._0_8_ = uVar6;
      local_b8._mp_d = puVar4;
    }
    local_a8._0_8_ = uVar3;
    local_a8._mp_d = pmVar2;
    if ((long)tu[0]._mp_alloc == 0) {
      iVar7 = (int)uVar3;
    }
    else {
      (*gmp_free_func)(tu[0]._mp_d,(long)tu[0]._mp_alloc << 3);
      iVar7 = local_a8._mp_alloc;
    }
    if (iVar7 != 0) {
      (*gmp_free_func)(local_a8._mp_d,(long)iVar7 << 3);
    }
    if ((long)local_c8._mp_alloc != 0) {
      (*gmp_free_func)(local_c8._mp_d,(long)local_c8._mp_alloc << 3);
    }
    if ((long)local_98._mp_alloc != 0) {
      (*gmp_free_func)(local_98._mp_d,(long)local_98._mp_alloc << 3);
    }
    if ((long)local_b8._mp_alloc != 0) {
      (*gmp_free_func)(local_b8._mp_d,(long)local_b8._mp_alloc << 3);
    }
    if ((long)t1[0]._mp_alloc != 0) {
      (*gmp_free_func)(t1[0]._mp_d,(long)t1[0]._mp_alloc << 3);
    }
  }
  return;
}

Assistant:

void
mpz_gcdext (mpz_t g, mpz_t s, mpz_t t, const mpz_t u, const mpz_t v)
{
  mpz_t tu, tv, s0, s1, t0, t1;
  mp_bitcnt_t uz, vz, gz;
  mp_bitcnt_t power;

  if (u->_mp_size == 0)
    {
      /* g = 0 u + sgn(v) v */
      signed long sign = mpz_sgn (v);
      mpz_abs (g, v);
      if (s)
	s->_mp_size = 0;
      if (t)
	mpz_set_si (t, sign);
      return;
    }

  if (v->_mp_size == 0)
    {
      /* g = sgn(u) u + 0 v */
      signed long sign = mpz_sgn (u);
      mpz_abs (g, u);
      if (s)
	mpz_set_si (s, sign);
      if (t)
	t->_mp_size = 0;
      return;
    }

  mpz_init (tu);
  mpz_init (tv);
  mpz_init (s0);
  mpz_init (s1);
  mpz_init (t0);
  mpz_init (t1);

  mpz_abs (tu, u);
  uz = mpz_make_odd (tu);
  mpz_abs (tv, v);
  vz = mpz_make_odd (tv);
  gz = GMP_MIN (uz, vz);

  uz -= gz;
  vz -= gz;

  /* Cofactors corresponding to odd gcd. gz handled later. */
  if (tu->_mp_size < tv->_mp_size)
    {
      mpz_swap (tu, tv);
      MPZ_SRCPTR_SWAP (u, v);
      MPZ_PTR_SWAP (s, t);
      MP_BITCNT_T_SWAP (uz, vz);
    }

  /* Maintain
   *
   * u = t0 tu + t1 tv
   * v = s0 tu + s1 tv
   *
   * where u and v denote the inputs with common factors of two
   * eliminated, and det (s0, t0; s1, t1) = 2^p. Then
   *
   * 2^p tu =  s1 u - t1 v
   * 2^p tv = -s0 u + t0 v
   */

  /* After initial division, tu = q tv + tu', we have
   *
   * u = 2^uz (tu' + q tv)
   * v = 2^vz tv
   *
   * or
   *
   * t0 = 2^uz, t1 = 2^uz q
   * s0 = 0,    s1 = 2^vz
   */

  mpz_tdiv_qr (t1, tu, tu, tv);
  mpz_mul_2exp (t1, t1, uz);

  mpz_setbit (s1, vz);
  power = uz + vz;

  if (tu->_mp_size > 0)
    {
      mp_bitcnt_t shift;
      shift = mpz_make_odd (tu);
      mpz_setbit (t0, uz + shift);
      power += shift;

      for (;;)
	{
	  int c;
	  c = mpz_cmp (tu, tv);
	  if (c == 0)
	    break;

	  if (c < 0)
	    {
	      /* tv = tv' + tu
	       *
	       * u = t0 tu + t1 (tv' + tu) = (t0 + t1) tu + t1 tv'
	       * v = s0 tu + s1 (tv' + tu) = (s0 + s1) tu + s1 tv' */

	      mpz_sub (tv, tv, tu);
	      mpz_add (t0, t0, t1);
	      mpz_add (s0, s0, s1);

	      shift = mpz_make_odd (tv);
	      mpz_mul_2exp (t1, t1, shift);
	      mpz_mul_2exp (s1, s1, shift);
	    }
	  else
	    {
	      mpz_sub (tu, tu, tv);
	      mpz_add (t1, t0, t1);
	      mpz_add (s1, s0, s1);

	      shift = mpz_make_odd (tu);
	      mpz_mul_2exp (t0, t0, shift);
	      mpz_mul_2exp (s0, s0, shift);
	    }
	  power += shift;
	}
    }
  else
    mpz_setbit (t0, uz);

  /* Now tv = odd part of gcd, and -s0 and t0 are corresponding
     cofactors. */

  mpz_mul_2exp (tv, tv, gz);
  mpz_neg (s0, s0);

  /* 2^p g = s0 u + t0 v. Eliminate one factor of two at a time. To
     adjust cofactors, we need u / g and v / g */

  mpz_divexact (s1, v, tv);
  mpz_abs (s1, s1);
  mpz_divexact (t1, u, tv);
  mpz_abs (t1, t1);

  while (power-- > 0)
    {
      /* s0 u + t0 v = (s0 - v/g) u - (t0 + u/g) v */
      if (mpz_odd_p (s0) || mpz_odd_p (t0))
	{
	  mpz_sub (s0, s0, s1);
	  mpz_add (t0, t0, t1);
	}
      assert (mpz_even_p (t0) && mpz_even_p (s0));
      mpz_tdiv_q_2exp (s0, s0, 1);
      mpz_tdiv_q_2exp (t0, t0, 1);
    }

  /* Arrange so that |s| < |u| / 2g */
  mpz_add (s1, s0, s1);
  if (mpz_cmpabs (s0, s1) > 0)
    {
      mpz_swap (s0, s1);
      mpz_sub (t0, t0, t1);
    }
  if (u->_mp_size < 0)
    mpz_neg (s0, s0);
  if (v->_mp_size < 0)
    mpz_neg (t0, t0);

  mpz_swap (g, tv);
  if (s)
    mpz_swap (s, s0);
  if (t)
    mpz_swap (t, t0);

  mpz_clear (tu);
  mpz_clear (tv);
  mpz_clear (s0);
  mpz_clear (s1);
  mpz_clear (t0);
  mpz_clear (t1);
}